

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_map_window(CImgDisplay *this)

{
  X11_info *pXVar1;
  long in_RDI;
  XEvent event;
  XWindowAttributes attr;
  bool is_mapped;
  bool is_exposed;
  Display *dpy;
  byte local_16d;
  int local_160 [48];
  undefined4 local_a0;
  undefined4 local_9c;
  int local_44;
  byte local_12;
  byte local_11;
  Display *local_10;
  
  pXVar1 = cimg::X11_attr();
  local_10 = pXVar1->display;
  local_11 = 0;
  local_12 = 0;
  XMapRaised(local_10,*(undefined8 *)(in_RDI + 0x4d0));
  do {
    XWindowEvent(local_10,*(undefined8 *)(in_RDI + 0x4d0),0x28000,local_160);
    if (local_160[0] == 0xc) {
      local_11 = 1;
    }
    else if (local_160[0] == 0x13) {
      local_12 = 1;
    }
    local_16d = 1;
    if ((local_11 & 1) != 0) {
      local_16d = local_12 ^ 0xff;
    }
  } while ((local_16d & 1) != 0);
  do {
    XGetWindowAttributes(local_10,*(undefined8 *)(in_RDI + 0x4d0),&local_a0);
    if (local_44 != 2) {
      XSync(local_10,0);
      cimg::sleep(10);
    }
  } while (local_44 != 2);
  *(undefined4 *)(in_RDI + 0x10) = local_a0;
  *(undefined4 *)(in_RDI + 0x14) = local_9c;
  return;
}

Assistant:

void _map_window() {
      Display *const dpy = cimg::X11_attr().display;
      bool is_exposed = false, is_mapped = false;
      XWindowAttributes attr;
      XEvent event;
      XMapRaised(dpy,_window);
      do { // Wait for the window to be mapped.
        XWindowEvent(dpy,_window,StructureNotifyMask | ExposureMask,&event);
        switch (event.type) {
        case MapNotify : is_mapped = true; break;
        case Expose : is_exposed = true; break;
        }
      } while (!is_exposed || !is_mapped);
      do { // Wait for the window to be visible.
        XGetWindowAttributes(dpy,_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,False); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
      _window_x = attr.x;
      _window_y = attr.y;
    }